

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,StringTree *params_3,
          ArrayPtr<const_char> *params_4,CappedArray<char,_14UL> *params_5,
          ArrayPtr<const_char> *params_6,StringTree *params_7,ArrayPtr<const_char> *params_8,
          StringTree *params_9,ArrayPtr<const_char> *params_10,StringTree *params_11,
          ArrayPtr<const_char> *params_12,StringTree *params_13,ArrayPtr<const_char> *params_14,
          ArrayPtr<const_char> *params_15,StringTree *params_16,ArrayPtr<const_char> *params_17,
          ArrayPtr<const_char> *params_18,StringTree *params_19,StringTree *params_20,
          ArrayPtr<const_char> *params_21)

{
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_128;
  StringTree *local_110;
  ArrayPtr<const_char> *local_108;
  ArrayPtr<const_char> *local_100;
  StringTree *local_f8;
  StringTree *local_f0;
  char *local_e8;
  size_t sStack_e0;
  size_t local_d8;
  char *local_d0;
  char *local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  size_t sStack_70;
  char *local_68;
  char *local_60;
  size_t sStack_58;
  char *local_50;
  size_t sStack_48;
  char *local_40;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_e8 = (this->text).content.ptr;
  sStack_e0 = params->size_;
  local_d8 = params_1->size_;
  local_d0 = params_2->ptr;
  local_c8 = (params_3->text).content.ptr;
  pcStack_c0 = params_4->ptr;
  local_b8 = *(undefined8 *)params_5->content;
  local_b0 = params_6->ptr;
  local_a8 = (params_7->text).content.ptr;
  local_a0 = params_8->ptr;
  local_98 = (params_9->text).content.ptr;
  local_90 = params_10->ptr;
  local_88 = (params_11->text).content.ptr;
  local_80 = params_12->ptr;
  local_78 = (params_13->text).content.ptr;
  sStack_70 = params_14->size_;
  local_68 = params_15->ptr;
  local_60 = (params_16->text).content.ptr;
  sStack_58 = params_17->size_;
  local_50 = params_18->ptr;
  sStack_48 = params_19->size_;
  local_40 = (params_20->text).content.ptr;
  nums._M_len = (size_type)params_8;
  nums._M_array = (iterator)0x16;
  local_f0 = (StringTree *)params_2;
  sVar1 = _::sum((_ *)&local_e8,nums);
  __return_storage_ptr__->size_ = sVar1;
  local_e8 = (this->text).content.ptr;
  sStack_e0 = params->size_;
  local_d8 = params_1->size_;
  local_d0 = (char *)0x0;
  local_c8 = (params_3->text).content.ptr;
  pcStack_c0 = params_4->ptr;
  local_b8 = *(undefined8 *)params_5->content;
  local_b0 = (char *)0x0;
  local_a8 = (params_7->text).content.ptr;
  local_a0 = (char *)0x0;
  local_98 = (params_9->text).content.ptr;
  local_90 = (char *)0x0;
  local_88 = (params_11->text).content.ptr;
  local_80 = (char *)0x0;
  local_78 = (params_13->text).content.ptr;
  sStack_70 = params_14->size_;
  local_68 = (char *)0x0;
  local_60 = (params_16->text).content.ptr;
  sStack_58 = params_17->size_;
  local_50 = (char *)0x0;
  sStack_48 = 0;
  local_40 = (params_20->text).content.ptr;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x16;
  local_110 = this;
  local_108 = params;
  local_100 = params_1;
  local_f8 = params_3;
  sVar1 = _::sum((_ *)&local_e8,nums_00);
  heapString((String *)&local_128,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_128);
  Array<char>::~Array((Array<char> *)&local_128);
  local_d8 = 0;
  local_e8 = (char *)0x0;
  sStack_e0 = 0;
  local_d0 = (char *)0x1;
  local_c8 = (char *)0x0;
  pcStack_c0 = (char *)0x0;
  local_b8 = 0;
  local_b0 = (char *)0x1;
  local_a8 = (char *)0x0;
  local_a0 = (char *)0x1;
  local_98 = (char *)0x0;
  local_90 = (char *)0x1;
  local_88 = (char *)0x0;
  local_80 = (char *)0x1;
  local_78 = (char *)0x0;
  sStack_70 = 0;
  local_68 = (char *)0x1;
  local_60 = (char *)0x0;
  sStack_58 = 0;
  local_50 = (char *)0x1;
  sStack_48 = 1;
  local_40 = (char *)0x0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x16;
  sVar1 = _::sum((_ *)&local_e8,nums_01);
  local_128.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_128.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_128.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_128);
  Array<kj::StringTree::Branch>::~Array(&local_128);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_110,local_108,local_100,
             local_f0,(ArrayPtr<const_char> *)local_f8,(CappedArray<char,_14UL> *)params_4,
             (ArrayPtr<const_char> *)params_5,(StringTree *)params_6,
             (ArrayPtr<const_char> *)params_7,(StringTree *)params_8,
             (ArrayPtr<const_char> *)params_9,(StringTree *)params_10,
             (ArrayPtr<const_char> *)params_11,(StringTree *)params_12,
             (ArrayPtr<const_char> *)params_13,params_14,(StringTree *)params_15,
             (ArrayPtr<const_char> *)params_16,params_17,(StringTree *)params_18,params_19,
             (ArrayPtr<const_char> *)params_20);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}